

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniGUI.c
# Opt level: O1

void EPD_DrawEllipse(uint16_t Xpos,uint16_t Ypos,uint16_t XRadius,uint16_t YRadius,uint8_t color)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined6 in_register_0000000a;
  int iVar5;
  undefined6 in_register_00000012;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  
  iVar5 = (int)CONCAT62(in_register_00000012,XRadius);
  iVar3 = (int)CONCAT62(in_register_0000000a,YRadius);
  iVar2 = iVar5 * -2 + 2;
  iVar4 = -iVar3;
  iVar9 = 0;
  do {
    iVar7 = (int)((float)iVar9 / ((float)iVar3 / (float)iVar5));
    uVar6 = (uint)Xpos - iVar7;
    uVar11 = iVar4 + (uint)Ypos;
    if (((ushort)uVar6 < gstI80DevInfo.usPanelW) && ((ushort)uVar11 < gstI80DevInfo.usPanelH)) {
      gpFrameBuf[(uVar6 & 0xffff) + (uint)gstI80DevInfo.usPanelW * (uVar11 & 0xffff)] = color;
    }
    uVar8 = iVar7 + (uint)Xpos;
    if (((ushort)uVar8 < gstI80DevInfo.usPanelW) && ((ushort)uVar11 < gstI80DevInfo.usPanelH)) {
      gpFrameBuf[(uVar8 & 0xffff) + (uint)gstI80DevInfo.usPanelW * (uVar11 & 0xffff)] = color;
    }
    uVar11 = (uint)Ypos - iVar4;
    if (((ushort)uVar8 < gstI80DevInfo.usPanelW) && ((ushort)uVar11 < gstI80DevInfo.usPanelH)) {
      gpFrameBuf[(uVar8 & 0xffff) + (uint)gstI80DevInfo.usPanelW * (uVar11 & 0xffff)] = color;
    }
    if (((ushort)uVar6 < gstI80DevInfo.usPanelW) && ((ushort)uVar11 < gstI80DevInfo.usPanelH)) {
      gpFrameBuf[(uVar6 & 0xffff) + (uint)gstI80DevInfo.usPanelW * (uVar11 & 0xffff)] = color;
    }
    iVar7 = iVar2;
    if (iVar2 <= iVar9) {
      iVar10 = iVar9 + 1;
      iVar7 = iVar2 + iVar9 * 2 + 3;
      iVar9 = iVar10;
      if ((iVar10 + iVar4 == 0) && (iVar2 <= iVar4)) {
        iVar2 = 0;
      }
    }
    iVar1 = iVar4 + 1;
    iVar10 = iVar4 * 2 + 3;
    if (iVar2 <= iVar4) {
      iVar1 = iVar4;
      iVar10 = 0;
    }
    iVar4 = iVar1;
    iVar2 = iVar10 + iVar7;
  } while (iVar4 < 1);
  return;
}

Assistant:

void EPD_DrawEllipse(uint16_t Xpos, uint16_t Ypos, uint16_t XRadius, uint16_t YRadius, uint8_t color)
{
  int32_t x = 0, y = -YRadius, err = 2-2*XRadius, e2;
  float k = 0, rad1 = 0, rad2 = 0;
  
  rad1 = XRadius;
  rad2 = YRadius;
  
  k = (float)(rad2/rad1);  
  
  do { 
    EPD_DrawPixel((Xpos-(uint16_t)(x/k)), (Ypos+y), color);
    EPD_DrawPixel((Xpos+(uint16_t)(x/k)), (Ypos+y), color);
    EPD_DrawPixel((Xpos+(uint16_t)(x/k)), (Ypos-y), color);
    EPD_DrawPixel((Xpos-(uint16_t)(x/k)), (Ypos-y), color);      
    
    e2 = err;
    if (e2 <= x) {
      err += ++x*2+1;
      if (-y == x && e2 <= y) e2 = 0;
    }
    if (e2 > y) err += ++y*2+1;     
  }
  while (y <= 0);
}